

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

int dill_is_label_mark(dill_stream_conflict s)

{
  int current_loc;
  int i;
  branch_table *t;
  dill_stream_conflict s_local;
  
  i = 0;
  while( true ) {
    if ((s->p->branch_table).max_alloc <= i) {
      return 0;
    }
    if (*(s->p->branch_table).label_locs == (int)s->p->cur_ip - (int)s->p->code_base) break;
    i = i + 1;
  }
  return 1;
}

Assistant:

extern int
dill_is_label_mark(dill_stream s)
{
    struct branch_table* t = &s->p->branch_table;
    int i;
    int current_loc = (int)((char*)s->p->cur_ip - (char*)s->p->code_base);
    for (i = 0; i < t->max_alloc; i++) {
        if (t->label_locs[0] == current_loc)
            return 1;
    }
    return 0;
}